

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addMeanSquareError<CoreML::Specification::NeuralNetwork>
               (Model *m,NeuralNetwork *nn,char *lossName,char *mseInputName,char *targetName)

{
  string *psVar1;
  NetworkUpdateParameters *this;
  Type *this_00;
  MeanSquaredErrorLossLayer *pMVar2;
  LogMessage *other;
  Type *this_01;
  ModelDescription *pMVar3;
  FeatureDescription output;
  LogFinisher local_99;
  FeatureDescription local_98;
  LogMessage local_68;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(nn->updateparams_->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  if (this_00->_oneof_case_[0] != 0xb) {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 0xb;
    pMVar2 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    CoreML::Specification::MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(pMVar2);
    (this_00->LossLayerType_).meansquarederrorlosslayer_ = pMVar2;
  }
  pMVar2 = (this_00->LossLayerType_).meansquarederrorlosslayer_;
  CoreML::Specification::MeanSquaredErrorLossLayer::set_input(pMVar2,mseInputName);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_target(pMVar2,targetName);
  pMVar3 = m->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  if ((pMVar3->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  CoreML::Specification::FeatureDescription::FeatureDescription
            (&local_98,
             (FeatureDescription *)((pMVar3->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    m->description_ = pMVar3;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(m->description_->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::CopyFrom(this_01,&local_98);
  psVar1 = (this_01->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this_01->name_,(pMVar2->target_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}